

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleTypeHandler<2UL>::GetProperty
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,Var originalInstance,
          PropertyId propertyId,Var *value,PropertyValueInfo *info,ScriptContext *requestContext)

{
  byte bVar1;
  ScriptContext *this_00;
  bool bVar2;
  BOOL BVar3;
  ulong uVar4;
  Var pvVar5;
  RecyclableObject *pRVar6;
  ulong uVar7;
  anon_union_8_2_5e5949cc_for_SimplePropertyDescriptor_1 *paVar8;
  uint32 local_3c;
  Var *ppvStack_38;
  uint32 indexVal;
  
  uVar7 = 0;
  uVar4 = (ulong)(uint)this->propertyCount;
  if (this->propertyCount < 1) {
    uVar4 = uVar7;
  }
  paVar8 = &this->descriptors[0].field_1;
  do {
    ppvStack_38 = value;
    if (uVar4 == uVar7) {
      this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                super_JavascriptLibraryBase).scriptContext.ptr;
      bVar2 = DynamicObject::HasObjectArray(instance);
      if ((bVar2) &&
         (BVar3 = ScriptContext::IsNumericPropertyId(this_00,propertyId,&local_3c), BVar3 != 0)) {
        BVar3 = DynamicTypeHandler::GetItem
                          (&this->super_DynamicTypeHandler,instance,originalInstance,local_3c,
                           ppvStack_38,this_00);
      }
      else {
LAB_00cbea02:
        pRVar6 = ScriptContext::GetMissingPropertyResult(requestContext);
        *ppvStack_38 = pRVar6;
        BVar3 = 0;
      }
      return BVar3;
    }
    if (((((Type *)(paVar8 + -1))->Id).ptr)->pid == propertyId) {
      if ((paVar8->Attributes & 8) == 0) {
        pvVar5 = DynamicObject::GetSlot(instance,(int)uVar7);
        *ppvStack_38 = pvVar5;
        if (info == (PropertyValueInfo *)0x0) {
          return 1;
        }
        bVar1 = paVar8->Attributes;
        info->m_instance = &instance->super_RecyclableObject;
        info->m_propertyIndex = (PropertyIndex)uVar7;
        info->m_attributes = bVar1;
        info->flags = InlineCacheNoFlags;
        return 1;
      }
      goto LAB_00cbea02;
    }
    uVar7 = uVar7 + 1;
    paVar8 = paVar8 + 2;
  } while( true );
}

Assistant:

BOOL SimpleTypeHandler<size>::GetProperty(DynamicObject* instance, Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        for (int i = 0; i < propertyCount; i++)
        {
            if (descriptors[i].Id->GetPropertyId() == propertyId)
            {
                if (descriptors[i].Attributes & PropertyDeleted)
                {
                    *value = requestContext->GetMissingPropertyResult();
                    return false;
                }
                *value = instance->GetSlot(i);
                PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(i), descriptors[i].Attributes);
                return true;
            }
        }

        // Check numeric propertyId only if objectArray available
        uint32 indexVal;
        ScriptContext* scriptContext = instance->GetScriptContext();
        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::GetItem(instance, originalInstance, indexVal, value, scriptContext);
        }

        *value = requestContext->GetMissingPropertyResult();
        return false;
    }